

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

void websocket_optimize4broadcasts(intptr_t type,int enable)

{
  long lVar1;
  long *plVar2;
  fio_msg_metadata_fn callback;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (type + 0x22U < 3) {
    plVar2 = (long *)(&_DYNAMIC[9].d_val)[type];
    callback = (fio_msg_metadata_fn)(&_DYNAMIC[0xb].d_tag)[type];
    if (enable == 0) {
      LOCK();
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (*plVar2 == 0) {
        if (callback != (fio_msg_metadata_fn)0x0) {
          fio_lock(&fio_postoffice.meta.lock);
          uVar3 = fio_postoffice.meta.ary.end - fio_postoffice.meta.ary.start;
          if (uVar3 != 0) {
            uVar6 = fio_postoffice.meta.ary.start;
            sVar4 = fio_postoffice.meta.ary.end;
            if (fio_postoffice.meta.ary.end < fio_postoffice.meta.ary.start) {
              sVar4 = fio_postoffice.meta.ary.start;
            }
            for (; (sVar5 = sVar4, uVar6 < fio_postoffice.meta.ary.end &&
                   (sVar5 = uVar6, fio_postoffice.meta.ary.arry[uVar6] != callback));
                uVar6 = uVar6 + 1) {
            }
            uVar6 = sVar5 - fio_postoffice.meta.ary.start;
            if (uVar6 != 0xffffffffffffffff && sVar5 != fio_postoffice.meta.ary.end) {
              uVar7 = 0;
              if (0 < (long)(uVar6 + uVar3)) {
                uVar7 = uVar6 + uVar3;
              }
              if (-1 < (long)uVar6) {
                uVar7 = uVar6;
              }
              if (uVar7 < uVar3) {
                if (uVar7 == 0) {
                  fio_postoffice.meta.ary.start = fio_postoffice.meta.ary.start + 1;
                }
                else {
                  uVar7 = uVar7 + fio_postoffice.meta.ary.start;
                  fio_postoffice.meta.ary.end = fio_postoffice.meta.ary.end - 1;
                  if (uVar7 <= fio_postoffice.meta.ary.end &&
                      fio_postoffice.meta.ary.end - uVar7 != 0) {
                    memmove(fio_postoffice.meta.ary.arry + uVar7,
                            fio_postoffice.meta.ary.arry + uVar7 + 1,
                            (fio_postoffice.meta.ary.end - uVar7) * 8);
                  }
                }
              }
            }
          }
          LOCK();
          fio_postoffice.meta.lock = '\0';
          UNLOCK();
        }
        return;
      }
    }
    else {
      LOCK();
      lVar1 = *plVar2;
      *plVar2 = *plVar2 + 1;
      UNLOCK();
      if (lVar1 == 0) {
        fio_message_metadata_callback_set(callback,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void websocket_optimize4broadcasts(intptr_t type, int enable) {
  static intptr_t generic = 0;
  static intptr_t text = 0;
  static intptr_t binary = 0;
  fio_msg_metadata_s (*callback)(fio_str_info_s, fio_str_info_s, uint8_t);
  intptr_t *counter;
  switch ((0 - type)) {
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB):
    counter = &generic;
    callback = websocket_optimize_generic;
    break;
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB_TEXT):
    counter = &text;
    callback = websocket_optimize_text;
    break;
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB_BINARY):
    counter = &binary;
    callback = websocket_optimize_binary;
    break;
  default:
    return;
  }
  if (enable) {
    if (fio_atomic_add(counter, 1) == 1) {
      fio_message_metadata_callback_set(callback, 1);
    }
  } else {
    if (fio_atomic_sub(counter, 1) == 0) {
      fio_message_metadata_callback_set(callback, 0);
    }
  }
}